

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

void lyxml_correct_attr_ns(ly_ctx *ctx,lyxml_attr *attr,lyxml_elem *attr_parent,int copy_ns)

{
  lyxml_elem *plVar1;
  lyxml_ns *plVar2;
  lyxml_attr *plVar3;
  lyxml_elem *plVar4;
  lyxml_elem *plVar5;
  
  if ((attr->type != LYXML_ATTR_NS) &&
     (plVar3 = (lyxml_attr *)attr->ns, plVar1 = attr_parent, plVar3 != (lyxml_attr *)0x0)) {
    do {
      plVar4 = plVar1;
      plVar1 = plVar4->parent;
    } while (plVar1 != (lyxml_elem *)0x0);
    plVar1 = (lyxml_elem *)plVar3->ns;
    do {
      plVar5 = plVar1;
      plVar1 = plVar5->parent;
    } while (plVar1 != (lyxml_elem *)0x0);
    if (plVar5 != plVar4) {
      if (copy_ns == 0) {
        plVar3 = (lyxml_attr *)0x0;
      }
      else {
        plVar2 = lyxml_get_ns(attr_parent,plVar3->name);
        attr->ns = plVar2;
        if (plVar2 != (lyxml_ns *)0x0) {
          return;
        }
        plVar3 = lyxml_dup_attr(ctx,attr_parent,plVar3);
      }
      attr->ns = (lyxml_ns *)plVar3;
    }
  }
  return;
}

Assistant:

static void
lyxml_correct_attr_ns(struct ly_ctx *ctx, struct lyxml_attr *attr, struct lyxml_elem *attr_parent, int copy_ns)
{
    const struct lyxml_ns *tmp_ns;
    struct lyxml_elem *ns_root, *attr_root;

    if ((attr->type != LYXML_ATTR_NS) && attr->ns) {
        /* find the root of attr */
        for (attr_root = attr_parent; attr_root->parent; attr_root = attr_root->parent);

        /* find the root of attr NS */
        for (ns_root = attr->ns->parent; ns_root->parent; ns_root = ns_root->parent);

        /* attr NS is defined outside attr parent subtree */
        if (ns_root != attr_root) {
            if (copy_ns) {
                tmp_ns = attr->ns;
                /* we may have already copied the NS over? */
                attr->ns = lyxml_get_ns(attr_parent, tmp_ns->prefix);

                /* we haven't copied it over, copy it now */
                if (!attr->ns) {
                    attr->ns = (struct lyxml_ns *)lyxml_dup_attr(ctx, attr_parent, (struct lyxml_attr *)tmp_ns);
                }
            } else {
                attr->ns = NULL;
            }
        }
    }
}